

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_estimateCDictSize(size_t dictSize,int compressionLevel)

{
  ZSTD_compressionParameters cParams_00;
  size_t sVar1;
  undefined1 local_30 [8];
  ZSTD_compressionParameters cParams;
  int compressionLevel_local;
  size_t dictSize_local;
  
  cParams.targetLength = compressionLevel;
  unique0x100000ad = dictSize;
  ZSTD_getCParams((ZSTD_compressionParameters *)local_30,compressionLevel,0,dictSize);
  cParams_00.hashLog = cParams.windowLog;
  cParams_00.searchLog = cParams.chainLog;
  cParams_00.windowLog = local_30._0_4_;
  cParams_00.chainLog = local_30._4_4_;
  cParams_00.minMatch = cParams.hashLog;
  cParams_00.targetLength = cParams.searchLog;
  cParams_00.strategy = cParams.minMatch;
  sVar1 = ZSTD_estimateCDictSize_advanced(stack0xfffffffffffffff0,cParams_00,ZSTD_dlm_byCopy);
  return sVar1;
}

Assistant:

size_t ZSTD_estimateCDictSize(size_t dictSize, int compressionLevel)
{
    ZSTD_compressionParameters const cParams = ZSTD_getCParams(compressionLevel, 0, dictSize);
    return ZSTD_estimateCDictSize_advanced(dictSize, cParams, ZSTD_dlm_byCopy);
}